

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Opnd * __thiscall
Lowerer::LoadRuntimeInlineCacheOpnd
          (Lowerer *this,Instr *instr,PropertySymOpnd *propertySymOpnd,bool isHelper)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JITTimeFunctionBody *this_00;
  intptr_t inlineCache;
  Opnd *inlineCacheOpnd;
  bool isHelper_local;
  PropertySymOpnd *propertySymOpnd_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  if (propertySymOpnd->m_runtimeInlineCache == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0xcda,"(propertySymOpnd->m_runtimeInlineCache != 0)",
                       "propertySymOpnd->m_runtimeInlineCache != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = Func::GetJITFunctionBody(instr->m_func);
  bVar2 = JITTimeFunctionBody::HasInlineCachesOnFunctionObject(this_00);
  if ((!bVar2) || (bVar2 = Func::IsInlinee(instr->m_func), bVar2)) {
    inlineCache = (intptr_t)
                  IR::AddrOpnd::New(propertySymOpnd->m_runtimeInlineCache,
                                    AddrOpndKindDynamicInlineCache,this->m_func,true,(Var)0x0);
  }
  else {
    inlineCache = (intptr_t)
                  GetInlineCacheFromFuncObjectForRuntimeUse(this,instr,propertySymOpnd,isHelper);
  }
  return (Opnd *)inlineCache;
}

Assistant:

IR::Opnd *
Lowerer::LoadRuntimeInlineCacheOpnd(IR::Instr * instr, IR::PropertySymOpnd * propertySymOpnd, bool isHelper)
{
    Assert(propertySymOpnd->m_runtimeInlineCache != 0);
    IR::Opnd * inlineCacheOpnd = nullptr;
    if (instr->m_func->GetJITFunctionBody()->HasInlineCachesOnFunctionObject() && !instr->m_func->IsInlinee())
    {
        inlineCacheOpnd = this->GetInlineCacheFromFuncObjectForRuntimeUse(instr, propertySymOpnd, isHelper);
    }
    else
    {
        intptr_t inlineCache = propertySymOpnd->m_runtimeInlineCache;
        inlineCacheOpnd = IR::AddrOpnd::New(inlineCache, IR::AddrOpndKindDynamicInlineCache, this->m_func, /* dontEncode */ true);
    }
    return inlineCacheOpnd;
}